

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jasper.c
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *__stream;
  int iVar1;
  char *pcVar2;
  cmdopts_t *cmdopts_00;
  undefined8 uVar3;
  cmdopts_t *pcVar4;
  long lVar5;
  undefined8 uVar6;
  jas_cmprof_t *outprof;
  jas_image_t *newimage;
  int i;
  int_fast16_t numcmpts;
  double enctime;
  double dectime;
  jas_tmr_t enctmr;
  jas_tmr_t dectmr;
  jas_stream_t *out;
  jas_stream_t *in;
  cmdopts_t *cmdopts;
  jas_image_t *image;
  char **argv_local;
  int argc_local;
  
  pcVar2 = strrchr(*argv,0x2f);
  if (pcVar2 == (char *)0x0) {
    cmdname = *argv;
  }
  else {
    cmdname = pcVar2 + 1;
  }
  iVar1 = jas_init();
  if (iVar1 != 0) {
    abort();
  }
  cmdopts_00 = cmdopts_parse(argc,argv);
  if (cmdopts_00 == (cmdopts_t *)0x0) {
    fprintf(_stderr,"error: cannot parse command line\n");
    exit(1);
  }
  if (cmdopts_00->version != 0) {
    printf("%s\n","2.0.16");
    __stream = _stderr;
    uVar3 = jas_getversion();
    fprintf(__stream,"libjasper %s\n",uVar3);
    exit(0);
  }
  jas_setdbglevel(cmdopts_00->debug);
  if (cmdopts_00->verbose != 0) {
    cmdinfo();
  }
  if (cmdopts_00->infile == (char *)0x0) {
    out = (jas_stream_t *)jas_stream_fdopen(0,"rb");
    if (out == (jas_stream_t *)0x0) {
      fprintf(_stderr,"error: cannot open standard input\n");
      exit(1);
    }
  }
  else {
    out = (jas_stream_t *)jas_stream_fopen(cmdopts_00->infile,"rb");
    if (out == (jas_stream_t *)0x0) {
      fprintf(_stderr,"error: cannot open input image file %s\n",cmdopts_00->infile);
      exit(1);
    }
  }
  if (cmdopts_00->outfile == (char *)0x0) {
    dectmr.stop.tv_usec = jas_stream_fdopen(1,"w+b");
    if (dectmr.stop.tv_usec == 0) {
      fprintf(_stderr,"error: cannot open standard output\n");
      exit(1);
    }
  }
  else {
    dectmr.stop.tv_usec = jas_stream_fopen(cmdopts_00->outfile,"w+b");
    if (dectmr.stop.tv_usec == 0) {
      fprintf(_stderr,"error: cannot open output image file %s\n",cmdopts_00->outfile);
      exit(1);
    }
  }
  if (cmdopts_00->infmt < 0) {
    iVar1 = jas_image_getfmt(out);
    cmdopts_00->infmt = iVar1;
    if (iVar1 < 0) {
      fprintf(_stderr,"error: input image has unknown format\n");
      exit(1);
    }
  }
  jas_tmr_start(&enctmr.stop.tv_usec);
  pcVar4 = (cmdopts_t *)jas_image_decode(out,cmdopts_00->infmt,cmdopts_00->inopts);
  if (pcVar4 == (cmdopts_t *)0x0) {
    fprintf(_stderr,"error: cannot load image data\n");
    exit(1);
  }
  jas_tmr_stop(&enctmr.stop.tv_usec);
  uVar3 = jas_tmr_get(&enctmr.stop.tv_usec);
  newimage._4_4_ = *(uint *)(pcVar4->inoptsbuf + 8);
  if ((-1 < cmdopts_00->cmptno) && (cmdopts_00->cmptno < (long)(ulong)newimage._4_4_)) {
    while (newimage._4_4_ = newimage._4_4_ - 1, -1 < (int)newimage._4_4_) {
      if ((long)(int)newimage._4_4_ != cmdopts_00->cmptno) {
        jas_image_delcmpt(pcVar4,newimage._4_4_);
      }
    }
  }
  cmdopts = pcVar4;
  if (cmdopts_00->srgb != 0) {
    jas_eprintf("forcing conversion to sRGB\n");
    lVar5 = jas_cmprof_createfromclrspc(0x401);
    if (lVar5 == 0) {
      jas_eprintf("cannot create sRGB profile\n");
      exit(1);
    }
    cmdopts = (cmdopts_t *)jas_image_chclrspc(pcVar4,lVar5,0);
    if (cmdopts == (cmdopts_t *)0x0) {
      jas_eprintf("cannot convert to sRGB\n");
      exit(1);
    }
    jas_image_destroy(pcVar4);
    jas_cmprof_destroy(lVar5);
  }
  jas_tmr_start(&dectime);
  iVar1 = jas_image_encode(cmdopts,dectmr.stop.tv_usec,cmdopts_00->outfmt,cmdopts_00->outopts);
  if (iVar1 != 0) {
    fprintf(_stderr,"error: cannot encode image\n");
    exit(1);
  }
  jas_stream_flush(dectmr.stop.tv_usec);
  jas_tmr_stop(&dectime);
  uVar6 = jas_tmr_get(&dectime);
  if (cmdopts_00->verbose != 0) {
    fprintf(_stderr,"decoding time = %f\n",uVar3);
    fprintf(_stderr,"encoding time = %f\n",uVar6);
  }
  jas_stream_close(out);
  iVar1 = jas_stream_close(dectmr.stop.tv_usec);
  if (iVar1 == 0) {
    cmdopts_destroy(cmdopts_00);
    jas_image_destroy(cmdopts);
    jas_image_clearfmts();
    return 0;
  }
  fprintf(_stderr,"error: cannot close output image file\n");
  exit(1);
}

Assistant:

int main(int argc, char **argv)
{
	jas_image_t *image;
	cmdopts_t *cmdopts;
	jas_stream_t *in;
	jas_stream_t *out;
	jas_tmr_t dectmr;
	jas_tmr_t enctmr;
	double dectime;
	double enctime;
	int_fast16_t numcmpts;
	int i;

	/* Determine the base name of this command. */
	if ((cmdname = strrchr(argv[0], '/'))) {
		++cmdname;
	} else {
		cmdname = argv[0];
	}

	if (jas_init()) {
		abort();
	}

	/* Parse the command line options. */
	if (!(cmdopts = cmdopts_parse(argc, argv))) {
		fprintf(stderr, "error: cannot parse command line\n");
		exit(EXIT_FAILURE);
	}

	if (cmdopts->version) {
		printf("%s\n", JAS_VERSION);
		fprintf(stderr, "libjasper %s\n", jas_getversion());
		exit(EXIT_SUCCESS);
	}

	jas_setdbglevel(cmdopts->debug);
#if defined(JAS_DEFAULT_MAX_MEM_USAGE)
	jas_set_max_mem_usage(cmdopts->max_mem);
#endif

	if (cmdopts->verbose) {
		cmdinfo();
	}

	/* Open the input image file. */
	if (cmdopts->infile) {
		/* The input image is to be read from a file. */
		if (!(in = jas_stream_fopen(cmdopts->infile, "rb"))) {
			fprintf(stderr, "error: cannot open input image file %s\n",
			  cmdopts->infile);
			exit(EXIT_FAILURE);
		}
	} else {
		/* The input image is to be read from standard input. */
		if (!(in = jas_stream_fdopen(0, "rb"))) {
			fprintf(stderr, "error: cannot open standard input\n");
			exit(EXIT_FAILURE);
		}
	}

	/* Open the output image file. */
	if (cmdopts->outfile) {
		/* The output image is to be written to a file. */
		if (!(out = jas_stream_fopen(cmdopts->outfile, "w+b"))) {
			fprintf(stderr, "error: cannot open output image file %s\n",
			  cmdopts->outfile);
			exit(EXIT_FAILURE);
		}
	} else {
		/* The output image is to be written to standard output. */
		if (!(out = jas_stream_fdopen(1, "w+b"))) {
			fprintf(stderr, "error: cannot open standard output\n");
			exit(EXIT_FAILURE);
		}
	}

	if (cmdopts->infmt < 0) {
		if ((cmdopts->infmt = jas_image_getfmt(in)) < 0) {
			fprintf(stderr, "error: input image has unknown format\n");
			exit(EXIT_FAILURE);
		}
	}

	/* Get the input image data. */
	jas_tmr_start(&dectmr);
	if (!(image = jas_image_decode(in, cmdopts->infmt, cmdopts->inopts))) {
		fprintf(stderr, "error: cannot load image data\n");
		exit(EXIT_FAILURE);
	}
	jas_tmr_stop(&dectmr);
	dectime = jas_tmr_get(&dectmr);

	/* If requested, throw away all of the components except one.
	  Why might this be desirable?  It is a hack, really.
	  None of the image formats other than the JPEG-2000 ones support
	  images with two, four, five, or more components.  This hack
	  allows such images to be decoded with the non-JPEG-2000 decoders,
	  one component at a time. */
	numcmpts = jas_image_numcmpts(image);
	if (cmdopts->cmptno >= 0 && cmdopts->cmptno < numcmpts) {
		for (i = numcmpts - 1; i >= 0; --i) {
			if (i != cmdopts->cmptno) {
				jas_image_delcmpt(image, i);
			}
		}
	}

	if (cmdopts->srgb) {
		jas_image_t *newimage;
		jas_cmprof_t *outprof;
		jas_eprintf("forcing conversion to sRGB\n");
		if (!(outprof = jas_cmprof_createfromclrspc(JAS_CLRSPC_SRGB))) {
			jas_eprintf("cannot create sRGB profile\n");
			exit(EXIT_FAILURE);
		}
		if (!(newimage = jas_image_chclrspc(image, outprof, JAS_CMXFORM_INTENT_PER))) {
			jas_eprintf("cannot convert to sRGB\n");
			exit(EXIT_FAILURE);
		}
		jas_image_destroy(image);
		jas_cmprof_destroy(outprof);
		image = newimage;
	}

	/* Generate the output image data. */
	jas_tmr_start(&enctmr);
	if (jas_image_encode(image, out, cmdopts->outfmt, cmdopts->outopts)) {
		fprintf(stderr, "error: cannot encode image\n");
		exit(EXIT_FAILURE);
	}
	jas_stream_flush(out);
	jas_tmr_stop(&enctmr);
	enctime = jas_tmr_get(&enctmr);

	if (cmdopts->verbose) {
		fprintf(stderr, "decoding time = %f\n", dectime);
		fprintf(stderr, "encoding time = %f\n", enctime);
	}

	/* If this fails, we don't care. */
	(void) jas_stream_close(in);

	/* Close the output image stream. */
	if (jas_stream_close(out)) {
		fprintf(stderr, "error: cannot close output image file\n");
		exit(EXIT_FAILURE);
	}

	cmdopts_destroy(cmdopts);
	jas_image_destroy(image);
	jas_image_clearfmts();

	/* Success at last! :-) */
	return EXIT_SUCCESS;
}